

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O1

int __thiscall ncnn::Padding::forward(Padding *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint _c;
  int *piVar2;
  size_t _elemsize;
  int iVar3;
  int iVar4;
  ulong uVar5;
  Mat borderm;
  Mat m;
  Mat local_a8;
  Mat local_68;
  
  if (((this->top == 0 && this->bottom == 0) && this->left == 0) && this->right == 0) {
    if (top_blob != bottom_blob) {
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 8))();
          }
        }
      }
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->allocator = bottom_blob->allocator;
      iVar1 = bottom_blob->w;
      iVar4 = bottom_blob->h;
      iVar3 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar1;
      top_blob->h = iVar4;
      top_blob->c = iVar3;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
  }
  else {
    iVar1 = bottom_blob->dims;
    _elemsize = bottom_blob->elemsize;
    iVar4 = this->right + this->left + bottom_blob->w;
    if (iVar1 == 1) {
      Mat::create(top_blob,iVar4,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_make_border_image<float>(bottom_blob,top_blob,0,this->left,this->type,this->value);
        return 0;
      }
      if (_elemsize == 1) {
        copy_make_border_image<signed_char>
                  (bottom_blob,top_blob,0,this->left,this->type,(char)(int)this->value);
        return 0;
      }
    }
    else {
      iVar3 = this->bottom + this->top + bottom_blob->h;
      if (iVar1 == 3) {
        _c = bottom_blob->c;
        Mat::create(top_blob,iVar4,iVar3,_c,_elemsize,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if ((int)_c < 1) {
          return 0;
        }
        uVar5 = 0;
        do {
          local_68.elemsize = bottom_blob->elemsize;
          local_68.allocator = bottom_blob->allocator;
          local_68.data =
               (void *)(bottom_blob->cstep * uVar5 * local_68.elemsize + (long)bottom_blob->data);
          local_68.refcount = (int *)0x0;
          local_68.w = bottom_blob->w;
          local_68.dims = 2;
          local_68.c = 1;
          local_68.h = bottom_blob->h;
          local_68.cstep = (size_t)(bottom_blob->h * bottom_blob->w);
          local_a8.elemsize = top_blob->elemsize;
          local_a8.allocator = top_blob->allocator;
          local_a8.data =
               (void *)(top_blob->cstep * uVar5 * local_a8.elemsize + (long)top_blob->data);
          local_a8.refcount = (int *)0x0;
          local_a8.w = top_blob->w;
          local_a8.dims = 2;
          local_a8.c = 1;
          local_a8.h = top_blob->h;
          local_a8.cstep = (size_t)(top_blob->h * top_blob->w);
          if (_elemsize == 4) {
            copy_make_border_image<float>
                      (&local_68,&local_a8,this->top,this->left,this->type,this->value);
          }
          else if (_elemsize == 1) {
            copy_make_border_image<signed_char>
                      (&local_68,&local_a8,this->top,this->left,this->type,(char)(int)this->value);
          }
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + -1;
            UNLOCK();
            if (*local_a8.refcount == 0) {
              if (local_a8.allocator == (Allocator *)0x0) {
                if (local_a8.data != (void *)0x0) {
                  free(*(void **)((long)local_a8.data + -8));
                }
              }
              else {
                (**(code **)(*(long *)local_a8.allocator + 8))();
              }
            }
          }
          local_a8.data = (void *)0x0;
          local_a8.refcount = (int *)0x0;
          local_a8.elemsize = 0;
          local_a8.cstep = 0;
          local_a8.dims = 0;
          local_a8.w = 0;
          local_a8.h = 0;
          local_a8.c = 0;
          if (local_68.refcount != (int *)0x0) {
            LOCK();
            *local_68.refcount = *local_68.refcount + -1;
            UNLOCK();
            if (*local_68.refcount == 0) {
              if (local_68.allocator == (Allocator *)0x0) {
                if (local_68.data != (void *)0x0) {
                  free(*(void **)((long)local_68.data + -8));
                }
              }
              else {
                (**(code **)(*(long *)local_68.allocator + 8))();
              }
            }
          }
          uVar5 = uVar5 + 1;
        } while (_c != uVar5);
        return 0;
      }
      if (iVar1 == 2) {
        Mat::create(top_blob,iVar4,iVar3,_elemsize,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (_elemsize == 4) {
          copy_make_border_image<float>
                    (bottom_blob,top_blob,this->top,this->left,this->type,this->value);
        }
        else if (_elemsize == 1) {
          copy_make_border_image<signed_char>
                    (bottom_blob,top_blob,this->top,this->left,this->type,(char)(int)this->value);
        }
      }
    }
  }
  return 0;
}

Assistant:

int Padding::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + left + right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, left, type, value);
        else if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, left, type, value);

        return 0;
    }

    int outh = h + top + bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, top, left, type, value);
        else if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, top, left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_make_border_image<signed char>(m, borderm, top, left, type, value);
            else if (elemsize == 4)
                copy_make_border_image<float>(m, borderm, top, left, type, value);
        }

        return 0;
    }

    return 0;
}